

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc:234:39)>_>
::Visit<>(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
          *this,EnumDescriptor *descriptor)

{
  FeatureSet *pFVar1;
  bool bVar2;
  ConstType pTVar3;
  EnumValueDescriptor *pEVar4;
  int index;
  LogMessage local_30;
  
  pFVar1 = *(FeatureSet **)(this + 0x30);
  bVar2 = FeatureSet::
          HasExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>>
                    (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                             *)pb::test);
  if (bVar2) {
    pTVar3 = FeatureSet::
             GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                       (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                *)pb::test);
    if ((undefined1  [76])((undefined1  [76])pTVar3->field_0 & (undefined1  [76])0x1) ==
        (undefined1  [76])0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                 ,0xee,"features.GetExtension(pb::test).has_file_feature()");
      absl::lts_20250127::log_internal::LogMessage::operator<<
                (&local_30,(char (*) [41])"Test features were not resolved properly");
    }
    else {
      pTVar3 = FeatureSet::
               GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                         (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                  *)pb::test);
      if ((undefined1  [76])((undefined1  [76])pTVar3->field_0 & (undefined1  [76])0x800) ==
          (undefined1  [76])0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (&local_30,(char (*) [41])"Test features were not resolved properly");
      }
      else {
        index = 0;
        do {
          if (*(int *)(this + 4) <= index) {
            return;
          }
          pEVar4 = EnumDescriptor::value((EnumDescriptor *)this,index);
          pFVar1 = pEVar4->merged_features_;
          bVar2 = FeatureSet::
                  HasExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>>
                            (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                     *)pb::test);
          if (!bVar2) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_30,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                       ,0xec,"features.HasExtension(pb::test)");
            absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&local_30,(char (*) [41])"Test features were not resolved properly");
            goto LAB_00180f51;
          }
          pTVar3 = FeatureSet::
                   GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                             (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                      *)pb::test);
          if ((undefined1  [76])((undefined1  [76])pTVar3->field_0 & (undefined1  [76])0x1) ==
              (undefined1  [76])0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_30,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                       ,0xee,"features.GetExtension(pb::test).has_file_feature()");
            absl::lts_20250127::log_internal::LogMessage::operator<<
                      (&local_30,(char (*) [41])"Test features were not resolved properly");
            goto LAB_00180f51;
          }
          pTVar3 = FeatureSet::
                   GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                             (pFVar1,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                      *)pb::test);
          index = index + 1;
        } while ((undefined1  [76])((undefined1  [76])pTVar3->field_0 & (undefined1  [76])0x800) !=
                 (undefined1  [76])0x0);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                   ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  (&local_30,(char (*) [41])"Test features were not resolved properly");
      }
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0xec,"features.HasExtension(pb::test)");
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_30,(char (*) [41])"Test features were not resolved properly");
  }
LAB_00180f51:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

void Visit(const EnumDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
    for (int i = 0; i < descriptor.value_count(); i++) {
      Visit(*descriptor.value(i), value(proto, i)...);
    }
  }